

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::C_Encrypt(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pData,CK_ULONG ulDataLen,
                  CK_BYTE_PTR pEncryptedData,CK_ULONG_PTR pulEncryptedDataLen)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Session *this_00;
  SymmetricAlgorithm *pSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  AsymmetricAlgorithm *pAVar5;
  PublicKey *pPVar6;
  uchar *puVar7;
  size_t sVar8;
  undefined4 extraout_var_02;
  ulong uVar9;
  CK_RV CVar10;
  CK_RV CStack_d0;
  ulong local_c0;
  ByteString encryptedData;
  ByteString data;
  ByteString local_58;
  
  if (this->isInitialised != true) {
    return 400;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  if (pData == (CK_BYTE_PTR)0x0 || pulEncryptedDataLen == (CK_ULONG_PTR)0x0) {
    Session::resetOp(this_00);
    return 7;
  }
  iVar2 = Session::getOpType(this_00);
  if (iVar2 != 2) {
    return 0x91;
  }
  pSVar4 = Session::getSymmetricCryptoOp(this_00);
  if (pSVar4 == (SymmetricAlgorithm *)0x0) {
    pAVar5 = Session::getAsymmetricCryptoOp(this_00);
    TVar3 = Session::getMechanism(this_00);
    pPVar6 = Session::getPublicKey(this_00);
    if ((pAVar5 == (AsymmetricAlgorithm *)0x0) ||
       (bVar1 = Session::getAllowSinglePartOp(this_00), pPVar6 == (PublicKey *)0x0 || !bVar1))
    goto LAB_0013206b;
    uVar9 = (**(code **)(*(long *)pPVar6 + 0x28))(pPVar6);
    if (pEncryptedData == (CK_BYTE_PTR)0x0) {
      *pulEncryptedDataLen = uVar9;
      return 0;
    }
    if (uVar9 <= *pulEncryptedDataLen) {
      ByteString::ByteString(&data);
      ByteString::ByteString(&encryptedData);
      if (TVar3 == RSA) {
        ByteString::wipe(&data,uVar9 - ulDataLen);
      }
      ByteString::ByteString(&local_58,pData,ulDataLen);
      ByteString::operator+=(&data,&local_58);
      ByteString::~ByteString(&local_58);
      iVar2 = (*pAVar5->_vptr_AsymmetricAlgorithm[10])(pAVar5,pPVar6,&data,&encryptedData,TVar3);
      if ((char)iVar2 != '\0') {
        sVar8 = ByteString::size(&encryptedData);
        if (sVar8 == uVar9) {
          puVar7 = ByteString::byte_str(&encryptedData);
          memcpy(pEncryptedData,puVar7,uVar9);
          *pulEncryptedDataLen = uVar9;
          Session::resetOp(this_00);
          CVar10 = 0;
          goto LAB_00132293;
        }
        softHSMLog(3,"AsymEncrypt",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0xa53,"The size of the encrypted data differs from the size of the mechanism");
      }
      Session::resetOp(this_00);
LAB_00132279:
      CVar10 = 5;
LAB_00132293:
      ByteString::~ByteString(&encryptedData);
      ByteString::~ByteString(&data);
      return CVar10;
    }
    *pulEncryptedDataLen = uVar9;
LAB_00132064:
    CStack_d0 = 0x150;
  }
  else {
    pSVar4 = Session::getSymmetricCryptoOp(this_00);
    if ((pSVar4 == (SymmetricAlgorithm *)0x0) ||
       (bVar1 = Session::getAllowSinglePartOp(this_00), !bVar1)) {
LAB_0013206b:
      Session::resetOp(this_00);
      return 0x91;
    }
    iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[0x11])(pSVar4);
    local_c0 = CONCAT44(extraout_var,iVar2) + ulDataLen;
    iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[0x13])(pSVar4);
    if ((char)iVar2 == '\0') {
LAB_00131fd7:
      iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[0x14])(pSVar4,ulDataLen);
      if ((char)iVar2 != '\0') {
        if (pEncryptedData == (CK_BYTE_PTR)0x0) {
          *pulEncryptedDataLen = local_c0;
          return 0;
        }
        if (local_c0 <= *pulEncryptedDataLen) {
          ByteString::ByteString(&data,pData,ulDataLen);
          ByteString::ByteString(&encryptedData);
          iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[3])(pSVar4,&data,&encryptedData);
          if ((char)iVar2 != '\0') {
            ByteString::ByteString(&local_58);
            iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[4])(pSVar4,&local_58);
            if ((char)iVar2 == '\0') {
              Session::resetOp(this_00);
              CVar10 = 5;
            }
            else {
              ByteString::operator+=(&encryptedData,&local_58);
              ByteString::resize(&encryptedData,local_c0);
              puVar7 = ByteString::byte_str(&encryptedData);
              sVar8 = ByteString::size(&encryptedData);
              memcpy(pEncryptedData,puVar7,sVar8);
              sVar8 = ByteString::size(&encryptedData);
              *pulEncryptedDataLen = sVar8;
              Session::resetOp(this_00);
              CVar10 = 0;
            }
            ByteString::~ByteString(&local_58);
            goto LAB_00132293;
          }
          Session::resetOp(this_00);
          goto LAB_00132279;
        }
        *pulEncryptedDataLen = local_c0;
        goto LAB_00132064;
      }
    }
    else {
      iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[0xd])(pSVar4);
      uVar9 = ulDataLen % CONCAT44(extraout_var_00,iVar2);
      iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[0xf])();
      if ((uVar9 == 0) || ((char)iVar2 != '\0')) {
        if (uVar9 == 0) {
          iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[0xf])(pSVar4);
          if ((char)iVar2 != '\0') {
            iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[0xd])(pSVar4);
            local_c0 = CONCAT44(extraout_var_02,iVar2) + ulDataLen;
          }
        }
        else {
          iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[0xd])();
          local_c0 = (ulDataLen - uVar9) + CONCAT44(extraout_var_01,iVar2);
        }
        goto LAB_00131fd7;
      }
    }
    Session::resetOp(this_00);
    CStack_d0 = 0x21;
  }
  return CStack_d0;
}

Assistant:

CK_RV SoftHSM::C_Encrypt(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pData, CK_ULONG ulDataLen, CK_BYTE_PTR pEncryptedData, CK_ULONG_PTR pulEncryptedDataLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	if ((pData == NULL_PTR) || (pulEncryptedDataLen == NULL_PTR))
	{
		// Fix issue 585
		session->resetOp();

		return CKR_ARGUMENTS_BAD;
	}

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_ENCRYPT)
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getSymmetricCryptoOp() != NULL)
		return SymEncrypt(session, pData, ulDataLen,
				  pEncryptedData, pulEncryptedDataLen);
	else
		return AsymEncrypt(session, pData, ulDataLen,
				   pEncryptedData, pulEncryptedDataLen);
}